

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibraryCase.cpp
# Opt level: O0

void deqp::sl::genCompareFunctions(ostringstream *stream,ValueBlock *valueBlock,bool useFloatTypes)

{
  size_type sVar1;
  const_reference pvVar2;
  Value *val;
  int valueNdx;
  int i;
  bool cmpTypeFound [94];
  bool useFloatTypes_local;
  ValueBlock *valueBlock_local;
  ostringstream *stream_local;
  
  for (val._4_4_ = 0; val._4_4_ < 0x5e; val._4_4_ = val._4_4_ + 1) {
    *(undefined1 *)((long)&valueNdx + (long)val._4_4_) = 0;
  }
  cmpTypeFound[0x57] = useFloatTypes;
  unique0x10000464 = valueBlock;
  for (val._0_4_ = 0;
      sVar1 = std::vector<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
              ::size(&stack0xffffffffffffffe8->values), (int)val < (int)sVar1;
      val._0_4_ = (int)val + 1) {
    pvVar2 = std::vector<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
             ::operator[](&stack0xffffffffffffffe8->values,(long)(int)val);
    if (pvVar2->storageType == STORAGE_OUTPUT) {
      *(undefined1 *)((long)&valueNdx + (long)(int)pvVar2->dataType) = 1;
    }
  }
  if ((cmpTypeFound[0x57] & 1U) == 0) {
    if ((cmpTypeFound[0x1b] & 1U) != 0) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (bool a, bool b)   { return (a == b); }\n");
    }
    if ((cmpTypeFound[0x1c] & 1U) != 0) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (bvec2 a, bvec2 b) { return (a == b); }\n");
    }
    if ((cmpTypeFound[0x1d] & 1U) != 0) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (bvec3 a, bvec3 b) { return (a == b); }\n");
    }
    if ((cmpTypeFound[0x1e] & 1U) != 0) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (bvec4 a, bvec4 b) { return (a == b); }\n");
    }
    if ((cmpTypeFound[0x13] & 1U) != 0) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (int a, int b)     { return (a == b); }\n");
    }
    if ((cmpTypeFound[0x14] & 1U) != 0) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (ivec2 a, ivec2 b) { return (a == b); }\n");
    }
    if ((cmpTypeFound[0x15] & 1U) != 0) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (ivec3 a, ivec3 b) { return (a == b); }\n");
    }
    if ((cmpTypeFound[0x16] & 1U) != 0) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (ivec4 a, ivec4 b) { return (a == b); }\n");
    }
    if ((cmpTypeFound[0x17] & 1U) != 0) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (uint a, uint b)   { return (a == b); }\n");
    }
    if ((cmpTypeFound[0x18] & 1U) != 0) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (uvec2 a, uvec2 b) { return (a == b); }\n");
    }
    if ((cmpTypeFound[0x19] & 1U) != 0) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (uvec3 a, uvec3 b) { return (a == b); }\n");
    }
    if ((cmpTypeFound[0x1a] & 1U) != 0) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (uvec4 a, uvec4 b) { return (a == b); }\n");
    }
  }
  else {
    if ((cmpTypeFound[0x1b] & 1U) != 0) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (float a, bool b) { return ((a > 0.5) == b); }\n");
    }
    if ((cmpTypeFound[0x1c] & 1U) != 0) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (vec2 a, bvec2 b) { return (greaterThan(a, vec2(0.5)) == b); }\n");
    }
    if ((cmpTypeFound[0x1d] & 1U) != 0) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (vec3 a, bvec3 b) { return (greaterThan(a, vec3(0.5)) == b); }\n");
    }
    if ((cmpTypeFound[0x1e] & 1U) != 0) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (vec4 a, bvec4 b) { return (greaterThan(a, vec4(0.5)) == b); }\n");
    }
    if ((cmpTypeFound[0x13] & 1U) != 0) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (float a, int b)  { float atemp = a+0.5; return (float(b) <= atemp && atemp <= float(b+1)); }\n"
                     );
    }
    if ((cmpTypeFound[0x14] & 1U) != 0) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (vec2 a, ivec2 b) { return (ivec2(floor(a + 0.5)) == b); }\n");
    }
    if ((cmpTypeFound[0x15] & 1U) != 0) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (vec3 a, ivec3 b) { return (ivec3(floor(a + 0.5)) == b); }\n");
    }
    if ((cmpTypeFound[0x16] & 1U) != 0) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (vec4 a, ivec4 b) { return (ivec4(floor(a + 0.5)) == b); }\n");
    }
    if ((cmpTypeFound[0x17] & 1U) != 0) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (float a, uint b) { float atemp = a+0.5; return (float(b) <= atemp && atemp <= float(b+1)); }\n"
                     );
    }
    if ((cmpTypeFound[0x18] & 1U) != 0) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (vec2 a, uvec2 b) { return (uvec2(floor(a + 0.5)) == b); }\n");
    }
    if ((cmpTypeFound[0x19] & 1U) != 0) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (vec3 a, uvec3 b) { return (uvec3(floor(a + 0.5)) == b); }\n");
    }
    if ((cmpTypeFound[0x1a] & 1U) != 0) {
      std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                      "bool isOk (vec4 a, uvec4 b) { return (uvec4(floor(a + 0.5)) == b); }\n");
    }
  }
  if ((valueNdx._1_1_ & 1) != 0) {
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    "bool isOk (float a, float b, float eps) { return (abs(a-b) <= (eps*abs(b) + eps)); }\n"
                   );
  }
  if ((valueNdx._2_1_ & 1) != 0) {
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    "bool isOk (vec2 a, vec2 b, float eps) { return all(lessThanEqual(abs(a-b), (eps*abs(b) + eps))); }\n"
                   );
  }
  if ((valueNdx._3_1_ & 1) != 0) {
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    "bool isOk (vec3 a, vec3 b, float eps) { return all(lessThanEqual(abs(a-b), (eps*abs(b) + eps))); }\n"
                   );
  }
  if (((byte)i & 1) != 0) {
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    "bool isOk (vec4 a, vec4 b, float eps) { return all(lessThanEqual(abs(a-b), (eps*abs(b) + eps))); }\n"
                   );
  }
  if ((i._1_1_ & 1) != 0) {
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    "bool isOk (mat2 a, mat2 b, float eps) { vec2 diff = max(abs(a[0]-b[0]), abs(a[1]-b[1])); return all(lessThanEqual(diff, vec2(eps))); }\n"
                   );
  }
  if ((i._2_1_ & 1) != 0) {
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    "bool isOk (mat2x3 a, mat2x3 b, float eps) { vec3 diff = max(abs(a[0]-b[0]), abs(a[1]-b[1])); return all(lessThanEqual(diff, vec3(eps))); }\n"
                   );
  }
  if ((i._3_1_ & 1) != 0) {
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    "bool isOk (mat2x4 a, mat2x4 b, float eps) { vec4 diff = max(abs(a[0]-b[0]), abs(a[1]-b[1])); return all(lessThanEqual(diff, vec4(eps))); }\n"
                   );
  }
  if ((cmpTypeFound[0] & 1U) != 0) {
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    "bool isOk (mat3x2 a, mat3x2 b, float eps) { vec2 diff = max(max(abs(a[0]-b[0]), abs(a[1]-b[1])), abs(a[2]-b[2])); return all(lessThanEqual(diff, vec2(eps))); }\n"
                   );
  }
  if ((cmpTypeFound[1] & 1U) != 0) {
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    "bool isOk (mat3 a, mat3 b, float eps) { vec3 diff = max(max(abs(a[0]-b[0]), abs(a[1]-b[1])), abs(a[2]-b[2])); return all(lessThanEqual(diff, vec3(eps))); }\n"
                   );
  }
  if ((cmpTypeFound[2] & 1U) != 0) {
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    "bool isOk (mat3x4 a, mat3x4 b, float eps) { vec4 diff = max(max(abs(a[0]-b[0]), abs(a[1]-b[1])), abs(a[2]-b[2])); return all(lessThanEqual(diff, vec4(eps))); }\n"
                   );
  }
  if ((cmpTypeFound[3] & 1U) != 0) {
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    "bool isOk (mat4x2 a, mat4x2 b, float eps) { vec2 diff = max(max(abs(a[0]-b[0]), abs(a[1]-b[1])), max(abs(a[2]-b[2]), abs(a[3]-b[3]))); return all(lessThanEqual(diff, vec2(eps))); }\n"
                   );
  }
  if ((cmpTypeFound[4] & 1U) != 0) {
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    "bool isOk (mat4x3 a, mat4x3 b, float eps) { vec3 diff = max(max(abs(a[0]-b[0]), abs(a[1]-b[1])), max(abs(a[2]-b[2]), abs(a[3]-b[3]))); return all(lessThanEqual(diff, vec3(eps))); }\n"
                   );
  }
  if ((cmpTypeFound[5] & 1U) != 0) {
    std::operator<<(&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                    "bool isOk (mat4 a, mat4 b, float eps) { vec4 diff = max(max(abs(a[0]-b[0]), abs(a[1]-b[1])), max(abs(a[2]-b[2]), abs(a[3]-b[3]))); return all(lessThanEqual(diff, vec4(eps))); }\n"
                   );
  }
  return;
}

Assistant:

static void genCompareFunctions(ostringstream& stream, const ShaderCase::ValueBlock& valueBlock, bool useFloatTypes)
{
	bool cmpTypeFound[TYPE_LAST];
	for (int i			= 0; i < TYPE_LAST; i++)
		cmpTypeFound[i] = false;

	for (int valueNdx = 0; valueNdx < (int)valueBlock.values.size(); valueNdx++)
	{
		const ShaderCase::Value& val = valueBlock.values[valueNdx];
		if (val.storageType == ShaderCase::Value::STORAGE_OUTPUT)
			cmpTypeFound[(int)val.dataType] = true;
	}

	if (useFloatTypes)
	{
		if (cmpTypeFound[TYPE_BOOL])
			stream << "bool isOk (float a, bool b) { return ((a > 0.5) == b); }\n";
		if (cmpTypeFound[TYPE_BOOL_VEC2])
			stream << "bool isOk (vec2 a, bvec2 b) { return (greaterThan(a, vec2(0.5)) == b); }\n";
		if (cmpTypeFound[TYPE_BOOL_VEC3])
			stream << "bool isOk (vec3 a, bvec3 b) { return (greaterThan(a, vec3(0.5)) == b); }\n";
		if (cmpTypeFound[TYPE_BOOL_VEC4])
			stream << "bool isOk (vec4 a, bvec4 b) { return (greaterThan(a, vec4(0.5)) == b); }\n";
		if (cmpTypeFound[TYPE_INT])
			stream << "bool isOk (float a, int b)  { float atemp = a+0.5; return (float(b) <= atemp && atemp <= "
					  "float(b+1)); }\n";
		if (cmpTypeFound[TYPE_INT_VEC2])
			stream << "bool isOk (vec2 a, ivec2 b) { return (ivec2(floor(a + 0.5)) == b); }\n";
		if (cmpTypeFound[TYPE_INT_VEC3])
			stream << "bool isOk (vec3 a, ivec3 b) { return (ivec3(floor(a + 0.5)) == b); }\n";
		if (cmpTypeFound[TYPE_INT_VEC4])
			stream << "bool isOk (vec4 a, ivec4 b) { return (ivec4(floor(a + 0.5)) == b); }\n";
		if (cmpTypeFound[TYPE_UINT])
			stream << "bool isOk (float a, uint b) { float atemp = a+0.5; return (float(b) <= atemp && atemp <= "
					  "float(b+1)); }\n";
		if (cmpTypeFound[TYPE_UINT_VEC2])
			stream << "bool isOk (vec2 a, uvec2 b) { return (uvec2(floor(a + 0.5)) == b); }\n";
		if (cmpTypeFound[TYPE_UINT_VEC3])
			stream << "bool isOk (vec3 a, uvec3 b) { return (uvec3(floor(a + 0.5)) == b); }\n";
		if (cmpTypeFound[TYPE_UINT_VEC4])
			stream << "bool isOk (vec4 a, uvec4 b) { return (uvec4(floor(a + 0.5)) == b); }\n";
	}
	else
	{
		if (cmpTypeFound[TYPE_BOOL])
			stream << "bool isOk (bool a, bool b)   { return (a == b); }\n";
		if (cmpTypeFound[TYPE_BOOL_VEC2])
			stream << "bool isOk (bvec2 a, bvec2 b) { return (a == b); }\n";
		if (cmpTypeFound[TYPE_BOOL_VEC3])
			stream << "bool isOk (bvec3 a, bvec3 b) { return (a == b); }\n";
		if (cmpTypeFound[TYPE_BOOL_VEC4])
			stream << "bool isOk (bvec4 a, bvec4 b) { return (a == b); }\n";
		if (cmpTypeFound[TYPE_INT])
			stream << "bool isOk (int a, int b)     { return (a == b); }\n";
		if (cmpTypeFound[TYPE_INT_VEC2])
			stream << "bool isOk (ivec2 a, ivec2 b) { return (a == b); }\n";
		if (cmpTypeFound[TYPE_INT_VEC3])
			stream << "bool isOk (ivec3 a, ivec3 b) { return (a == b); }\n";
		if (cmpTypeFound[TYPE_INT_VEC4])
			stream << "bool isOk (ivec4 a, ivec4 b) { return (a == b); }\n";
		if (cmpTypeFound[TYPE_UINT])
			stream << "bool isOk (uint a, uint b)   { return (a == b); }\n";
		if (cmpTypeFound[TYPE_UINT_VEC2])
			stream << "bool isOk (uvec2 a, uvec2 b) { return (a == b); }\n";
		if (cmpTypeFound[TYPE_UINT_VEC3])
			stream << "bool isOk (uvec3 a, uvec3 b) { return (a == b); }\n";
		if (cmpTypeFound[TYPE_UINT_VEC4])
			stream << "bool isOk (uvec4 a, uvec4 b) { return (a == b); }\n";
	}

	if (cmpTypeFound[TYPE_FLOAT])
		stream << "bool isOk (float a, float b, float eps) { return (abs(a-b) <= (eps*abs(b) + eps)); }\n";
	if (cmpTypeFound[TYPE_FLOAT_VEC2])
		stream
			<< "bool isOk (vec2 a, vec2 b, float eps) { return all(lessThanEqual(abs(a-b), (eps*abs(b) + eps))); }\n";
	if (cmpTypeFound[TYPE_FLOAT_VEC3])
		stream
			<< "bool isOk (vec3 a, vec3 b, float eps) { return all(lessThanEqual(abs(a-b), (eps*abs(b) + eps))); }\n";
	if (cmpTypeFound[TYPE_FLOAT_VEC4])
		stream
			<< "bool isOk (vec4 a, vec4 b, float eps) { return all(lessThanEqual(abs(a-b), (eps*abs(b) + eps))); }\n";

	if (cmpTypeFound[TYPE_FLOAT_MAT2])
		stream << "bool isOk (mat2 a, mat2 b, float eps) { vec2 diff = max(abs(a[0]-b[0]), abs(a[1]-b[1])); return "
				  "all(lessThanEqual(diff, vec2(eps))); }\n";
	if (cmpTypeFound[TYPE_FLOAT_MAT2X3])
		stream << "bool isOk (mat2x3 a, mat2x3 b, float eps) { vec3 diff = max(abs(a[0]-b[0]), abs(a[1]-b[1])); return "
				  "all(lessThanEqual(diff, vec3(eps))); }\n";
	if (cmpTypeFound[TYPE_FLOAT_MAT2X4])
		stream << "bool isOk (mat2x4 a, mat2x4 b, float eps) { vec4 diff = max(abs(a[0]-b[0]), abs(a[1]-b[1])); return "
				  "all(lessThanEqual(diff, vec4(eps))); }\n";
	if (cmpTypeFound[TYPE_FLOAT_MAT3X2])
		stream << "bool isOk (mat3x2 a, mat3x2 b, float eps) { vec2 diff = max(max(abs(a[0]-b[0]), abs(a[1]-b[1])), "
				  "abs(a[2]-b[2])); return all(lessThanEqual(diff, vec2(eps))); }\n";
	if (cmpTypeFound[TYPE_FLOAT_MAT3])
		stream << "bool isOk (mat3 a, mat3 b, float eps) { vec3 diff = max(max(abs(a[0]-b[0]), abs(a[1]-b[1])), "
				  "abs(a[2]-b[2])); return all(lessThanEqual(diff, vec3(eps))); }\n";
	if (cmpTypeFound[TYPE_FLOAT_MAT3X4])
		stream << "bool isOk (mat3x4 a, mat3x4 b, float eps) { vec4 diff = max(max(abs(a[0]-b[0]), abs(a[1]-b[1])), "
				  "abs(a[2]-b[2])); return all(lessThanEqual(diff, vec4(eps))); }\n";
	if (cmpTypeFound[TYPE_FLOAT_MAT4X2])
		stream << "bool isOk (mat4x2 a, mat4x2 b, float eps) { vec2 diff = max(max(abs(a[0]-b[0]), abs(a[1]-b[1])), "
				  "max(abs(a[2]-b[2]), abs(a[3]-b[3]))); return all(lessThanEqual(diff, vec2(eps))); }\n";
	if (cmpTypeFound[TYPE_FLOAT_MAT4X3])
		stream << "bool isOk (mat4x3 a, mat4x3 b, float eps) { vec3 diff = max(max(abs(a[0]-b[0]), abs(a[1]-b[1])), "
				  "max(abs(a[2]-b[2]), abs(a[3]-b[3]))); return all(lessThanEqual(diff, vec3(eps))); }\n";
	if (cmpTypeFound[TYPE_FLOAT_MAT4])
		stream << "bool isOk (mat4 a, mat4 b, float eps) { vec4 diff = max(max(abs(a[0]-b[0]), abs(a[1]-b[1])), "
				  "max(abs(a[2]-b[2]), abs(a[3]-b[3]))); return all(lessThanEqual(diff, vec4(eps))); }\n";
}